

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O3

int check_revocation(X509_STORE_CTX *ctx)

{
  X509_CRL *a;
  int iVar1;
  int iVar2;
  size_t sVar3;
  X509 *a_00;
  X509_NAME *nm;
  OPENSSL_STACK *sk;
  X509 *x;
  EVP_PKEY *r;
  int *pscore;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  int crl_score;
  X509 *issuer;
  int local_5c;
  X509_CRL *local_58;
  X509 *local_50;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  
  uVar4 = ctx->param->flags;
  if ((uVar4 & 4) == 0) {
    return 1;
  }
  uVar5 = 0;
  if ((uVar4 & 8) != 0) {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
    if ((int)sVar3 < 1) {
      local_48 = 1;
      goto LAB_001ad5e0;
    }
    uVar5 = (int)sVar3 - 1;
  }
  local_38 = (ulong)uVar5;
  uVar6 = (ulong)(uVar5 + 1);
  uVar4 = 0;
  local_48 = 0;
  local_40 = uVar6;
  do {
    ctx->error_depth = (int)uVar4;
    a_00 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,uVar4);
    ctx->current_cert = (X509 *)a_00;
    ctx->current_crl_issuer = (X509 *)0x0;
    ctx->current_crl_score = 0;
    local_50 = (X509 *)0x0;
    local_5c = 0;
    local_58 = (X509_CRL *)0x0;
    pscore = &local_5c;
    iVar1 = get_crl_sk(ctx,(X509_CRL **)&local_58,&local_50,pscore,ctx->crls);
    if (iVar1 == 0) {
      nm = (X509_NAME *)X509_get_issuer_name(a_00);
      sk = (OPENSSL_STACK *)X509_STORE_CTX_get1_crls(ctx,nm);
      pscore = (int *)CONCAT71((int7)((ulong)pscore >> 8),local_58 != (X509_CRL *)0x0);
      if (sk != (OPENSSL_STACK *)0x0 || local_58 == (X509_CRL *)0x0) {
        pscore = &local_5c;
        get_crl_sk(ctx,(X509_CRL **)&local_58,&local_50,pscore,(stack_st_X509_CRL *)sk);
        OPENSSL_sk_pop_free_ex(sk,sk_X509_CRL_call_free_func,X509_CRL_free);
        goto LAB_001ad389;
      }
LAB_001ad393:
      a = local_58;
      ctx->current_crl_issuer = local_50;
      ctx->current_crl_score = local_5c;
      ctx->current_crl = (X509_CRL *)local_58;
      iVar1 = ctx->error_depth;
      sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
      x = ctx->current_crl_issuer;
      if (x == (X509 *)0x0) {
        iVar2 = (int)sVar3 + -1;
        if (iVar1 < iVar2) {
          x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,(long)iVar1 + 1);
LAB_001ad451:
          if (x != (X509 *)0x0) goto LAB_001ad45a;
LAB_001ad53a:
          if (((ctx->param->flags & 0x10) == 0) && ((a->flags & 0x200) != 0)) {
            ctx->error = 0x24;
            uVar5 = (*ctx->verify_cb)(0,ctx);
            if (1 < uVar5) goto LAB_001ad5f7;
            if (uVar5 == 0) goto LAB_001ad5c7;
          }
          iVar1 = X509_CRL_get0_by_cert(a,(X509_REVOKED **)&local_50,a_00);
          uVar6 = local_40;
          if (iVar1 != 0) {
            ctx->error = 0x17;
            uVar5 = (*ctx->verify_cb)(0,ctx);
            if (1 < uVar5) {
LAB_001ad5f7:
              abort();
            }
            if (uVar5 == 0) goto LAB_001ad5c7;
          }
          X509_CRL_free(a);
          ctx->current_crl = (X509_CRL *)0x0;
          goto LAB_001ad5a8;
        }
        x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,(long)iVar2);
        iVar1 = x509_check_issued_with_callback(ctx,x,x);
        if (iVar1 != 0) goto LAB_001ad451;
        ctx->error = 0x21;
        uVar5 = (*ctx->verify_cb)(0,ctx);
        if (1 < uVar5) goto LAB_001ad5f7;
        if (uVar5 != 0) goto LAB_001ad451;
      }
      else {
LAB_001ad45a:
        if (((x->ex_flags & 2) != 0) && ((x->ex_kusage & 2) == 0)) {
          ctx->error = 0x23;
          uVar5 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar5) goto LAB_001ad5f7;
          if (uVar5 == 0) goto LAB_001ad5c7;
        }
        if ((ctx->current_crl_score & 0x80) == 0) {
          ctx->error = 0x2c;
          uVar5 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar5) goto LAB_001ad5f7;
          if (uVar5 == 0) goto LAB_001ad5c7;
        }
        if ((a->idp_flags & 2) != 0) {
          ctx->error = 0x29;
          uVar5 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar5) goto LAB_001ad5f7;
          if (uVar5 == 0) goto LAB_001ad5c7;
        }
        if (((ctx->current_crl_score & 0x40) != 0) ||
           (iVar1 = check_crl_time(ctx,(X509_CRL *)a,1), iVar1 != 0)) {
          r = (EVP_PKEY *)X509_get0_pubkey(x);
          if (r == (EVP_PKEY *)0x0) {
            ctx->error = 6;
          }
          else {
            iVar1 = X509_CRL_verify(a,r);
            if (0 < iVar1) goto LAB_001ad53a;
            ctx->error = 8;
          }
          uVar5 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar5) goto LAB_001ad5f7;
          if (uVar5 != 0) goto LAB_001ad53a;
        }
      }
LAB_001ad5c7:
      X509_CRL_free(a);
      ctx->current_crl = (X509_CRL *)0x0;
      break;
    }
LAB_001ad389:
    if (local_58 != (X509_CRL *)0x0) goto LAB_001ad393;
    ctx->error = 3;
    uVar5 = (*ctx->verify_cb)(0,ctx);
    if (1 < uVar5) goto LAB_001ad5f7;
    X509_CRL_free((X509_CRL *)0x0);
    ctx->current_crl = (X509_CRL *)0x0;
    if (uVar5 == 0) break;
LAB_001ad5a8:
    bVar7 = local_38 <= uVar4;
    uVar4 = uVar4 + 1;
    local_48 = CONCAT71((int7)((ulong)pscore >> 8),bVar7);
  } while (uVar6 != uVar4);
LAB_001ad5e0:
  return (byte)local_48 & 1;
}

Assistant:

static int check_revocation(X509_STORE_CTX *ctx) {
  if (!(ctx->param->flags & X509_V_FLAG_CRL_CHECK)) {
    return 1;
  }
  int last;
  if (ctx->param->flags & X509_V_FLAG_CRL_CHECK_ALL) {
    last = (int)sk_X509_num(ctx->chain) - 1;
  } else {
    last = 0;
  }
  for (int i = 0; i <= last; i++) {
    ctx->error_depth = i;
    if (!check_cert(ctx)) {
      return 0;
    }
  }
  return 1;
}